

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

NonceT __thiscall
tonk::SessionOutgoing::writeNonce(SessionOutgoing *this,uint8_t *footer,uint *footerBytesOut)

{
  NonceT NVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  NVar1 = this->NextNonce;
  this->NextNonce = NVar1 + 1;
  *footerBytesOut = 3;
  if (this->ShouldCompressSequenceNumbers == true) {
    uVar4 = (int)NVar1 - (int)(this->LastAck).PeerNextExpectedNonce.Value;
    uVar3 = 0;
    if (uVar4 != 1) {
      uVar2 = -uVar4;
      if (0 < (int)uVar4) {
        uVar2 = uVar4;
      }
      uVar3 = 1;
      if ((0x7e < uVar2) && (uVar3 = 2, 0x7ffe < uVar2)) goto LAB_0012b93b;
    }
    *footerBytesOut = uVar3;
  }
LAB_0012b93b:
  *(int *)footer = (int)NVar1;
  return NVar1;
}

Assistant:

NonceT SessionOutgoing::writeNonce(uint8_t* footer, unsigned& footerBytesOut)
{
    // Note nonce can roll over here back to 0, and that is okay because this
    // is not intended to provide real data security.
    NonceT nonce = NextNonce++;

    // Choose the number of bytes to send:
    footerBytesOut = 3;

#ifdef TONK_ENABLE_NONCE_COMPRESSION
    if (ShouldCompressSequenceNumbers)
    {
        // Use the magnitude of the difference between this nonce and the peer's
        // next expected nonce to decide how many bytes to send for the field.
        int32_t mag = (int32_t)nonce - (int32_t)LastAck.PeerNextExpectedNonce.ToUnsigned();

#if 1
        if (mag == 1) {
            footerBytesOut = 0;
        }
        else
#endif
        {
            if (mag < 0) {
                TONK_DEBUG_BREAK(); // Should never happen
                mag = -mag;
            }
            ++mag;
            TONK_DEBUG_ASSERT(mag < 0x800000);

            if (mag < 0x80) {
                footerBytesOut = 1;
            }
            else if (mag < 0x8000) {
                footerBytesOut = 2;
            }
        }
    }
#endif

    protocol::WriteFooterField(footer, (uint32_t)nonce, footerBytesOut);

    return nonce;
}